

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::SeekHead::Finalize(SeekHead *this,IMkvWriter *writer)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  uint64 uVar4;
  undefined8 uVar5;
  uint64_t uVar6;
  IMkvWriter *writer_00;
  long *in_RSI;
  IMkvWriter *in_RDI;
  uint64_t bytes_written;
  int64_t size_left;
  uint64_t total_size;
  uint64_t total_entry_size;
  int32_t i_1;
  int64_t pos;
  int32_t i;
  uint64_t entry_size [5];
  uint64_t payload_size;
  uint64 in_stack_ffffffffffffff68;
  IMkvWriter *in_stack_ffffffffffffff70;
  SeekHead *in_stack_ffffffffffffff80;
  int local_5c;
  int local_4c;
  uint64 auStack_48 [5];
  long local_20;
  long *local_18;
  
  local_18 = in_RSI;
  uVar3 = (**(code **)(*in_RSI + 0x18))();
  if ((uVar3 & 1) != 0) {
    if (in_RDI[8]._vptr_IMkvWriter == (_func_int **)0xffffffffffffffff) {
      return false;
    }
    local_20 = 0;
    for (local_4c = 0; local_4c < 5; local_4c = local_4c + 1) {
      if (*(int *)((long)&in_RDI->_vptr_IMkvWriter + (long)local_4c * 4) != 0) {
        uVar4 = EbmlElementSize((uint64)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        auStack_48[local_4c] = uVar4;
        uVar4 = EbmlElementSize((uint64)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        auStack_48[local_4c] = uVar4 + auStack_48[local_4c];
        uVar4 = EbmlMasterElementSize((uint64)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        local_20 = uVar4 + auStack_48[local_4c] + local_20;
      }
    }
    if (local_20 == 0) {
      return true;
    }
    uVar5 = (**(code **)(*local_18 + 8))();
    iVar2 = (**(code **)(*local_18 + 0x10))(local_18,in_RDI[8]._vptr_IMkvWriter);
    if (iVar2 != 0) {
      return false;
    }
    bVar1 = WriteEbmlMasterElement
                      (in_RDI,(uint64)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (!bVar1) {
      return false;
    }
    for (local_5c = 0; local_5c < 5; local_5c = local_5c + 1) {
      if (*(int *)((long)&in_RDI->_vptr_IMkvWriter + (long)local_5c * 4) != 0) {
        bVar1 = WriteEbmlMasterElement
                          (in_RDI,(uint64)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        if (!bVar1) {
          return false;
        }
        bVar1 = WriteEbmlElement(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0x16748c);
        if (!bVar1) {
          return false;
        }
        bVar1 = WriteEbmlElement(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0x1674be);
        if (!bVar1) {
          return false;
        }
      }
    }
    uVar6 = MaxEntrySize(in_stack_ffffffffffffff80);
    writer_00 = (IMkvWriter *)(uVar6 * 5);
    uVar4 = EbmlMasterElementSize((uint64)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    uVar4 = (long)&writer_00->_vptr_IMkvWriter + uVar4;
    (**(code **)(*local_18 + 8))();
    uVar4 = WriteVoidElement(writer_00,uVar4);
    if (uVar4 == 0) {
      return false;
    }
    iVar2 = (**(code **)(*local_18 + 0x10))(local_18,uVar5);
    if (iVar2 != 0) {
      return false;
    }
  }
  return true;
}

Assistant:

bool SeekHead::Finalize(IMkvWriter* writer) const {
  if (writer->Seekable()) {
    if (start_pos_ == -1)
      return false;

    uint64_t payload_size = 0;
    uint64_t entry_size[kSeekEntryCount];

    for (int32_t i = 0; i < kSeekEntryCount; ++i) {
      if (seek_entry_id_[i] != 0) {
        entry_size[i] = EbmlElementSize(libwebm::kMkvSeekID,
                                        static_cast<uint64>(seek_entry_id_[i]));
        entry_size[i] += EbmlElementSize(
            libwebm::kMkvSeekPosition, static_cast<uint64>(seek_entry_pos_[i]));

        payload_size +=
            EbmlMasterElementSize(libwebm::kMkvSeek, entry_size[i]) +
            entry_size[i];
      }
    }

    // No SeekHead elements
    if (payload_size == 0)
      return true;

    const int64_t pos = writer->Position();
    if (writer->Position(start_pos_))
      return false;

    if (!WriteEbmlMasterElement(writer, libwebm::kMkvSeekHead, payload_size))
      return false;

    for (int32_t i = 0; i < kSeekEntryCount; ++i) {
      if (seek_entry_id_[i] != 0) {
        if (!WriteEbmlMasterElement(writer, libwebm::kMkvSeek, entry_size[i]))
          return false;

        if (!WriteEbmlElement(writer, libwebm::kMkvSeekID,
                              static_cast<uint64>(seek_entry_id_[i])))
          return false;

        if (!WriteEbmlElement(writer, libwebm::kMkvSeekPosition,
                              static_cast<uint64>(seek_entry_pos_[i])))
          return false;
      }
    }

    const uint64_t total_entry_size = kSeekEntryCount * MaxEntrySize();
    const uint64_t total_size =
        EbmlMasterElementSize(libwebm::kMkvSeekHead, total_entry_size) +
        total_entry_size;
    const int64_t size_left = total_size - (writer->Position() - start_pos_);

    const uint64_t bytes_written = WriteVoidElement(writer, size_left);
    if (!bytes_written)
      return false;

    if (writer->Position(pos))
      return false;
  }

  return true;
}